

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

Track * __thiscall mkvparser::Tracks::GetTrackByNumber(Tracks *this,long tn)

{
  Track *pTVar1;
  Track **ppTVar2;
  
  if (-1 < tn) {
    for (ppTVar2 = this->m_trackEntries; ppTVar2 != this->m_trackEntriesEnd; ppTVar2 = ppTVar2 + 1)
    {
      pTVar1 = *ppTVar2;
      if ((pTVar1 != (Track *)0x0) && ((pTVar1->m_info).number == tn)) {
        return pTVar1;
      }
    }
  }
  return (Track *)0x0;
}

Assistant:

const Track* Tracks::GetTrackByNumber(long tn) const {
  if (tn < 0)
    return NULL;

  Track** i = m_trackEntries;
  Track** const j = m_trackEntriesEnd;

  while (i != j) {
    Track* const pTrack = *i++;

    if (pTrack == NULL)
      continue;

    if (tn == pTrack->GetNumber())
      return pTrack;
  }

  return NULL;  // not found
}